

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall
helics::BrokerBase::loadInfoFromToml(BrokerBase *this,string *tomlString,bool runArgParser)

{
  element_type *this_00;
  Time TVar1;
  size_type sVar2;
  shared_ptr<helics::helicsCLI11App> sVar3;
  shared_ptr<helics::helicsCLI11App> app;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  __shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> local_300 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8;
  istringstream tstring;
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 aaStack_2e8 [8];
  value doc;
  
  toml::basic_value<toml::type_config>::basic_value(&doc);
  fileops::loadToml((value *)&tstring,(string *)tomlString);
  toml::basic_value<toml::type_config>::operator=(&doc,(basic_value<toml::type_config> *)&tstring);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&tstring);
  if (runArgParser) {
    sVar3 = generateBaseCLI((BrokerBase *)&app);
    (*this->_vptr_BrokerBase[8])
              (&sApp,this,
               sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    this_00 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<helics::helicsCLI11App,void>
              (local_300,
               &sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>);
    CLI::App::add_subcommand(&this_00->super_App,(App_p *)local_300);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8);
    ((app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_App)
    .allow_extras_ = true;
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)&tstring);
    TVar1.internalTimeCode = _tstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_tstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_2e8[0]._0_8_;
    _tstring = 0;
    aaStack_2e8[0].integer_.value = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aaStack_2e8[0].boolean_);
    if ((element_type *)TVar1.internalTimeCode != (element_type *)0x0) {
      *(bool *)(TVar1.internalTimeCode + 0x50) = true;
    }
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(tomlString,'=',0);
    if (sVar2 == 0xffffffffffffffff) {
      std::ifstream::ifstream(&tstring,(string *)tomlString,_S_in);
      CLI::App::parse_from_stream
                (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_App,(istream *)&tstring);
      std::ifstream::~ifstream(&tstring);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&tstring,(string *)tomlString,_S_in);
      CLI::App::parse_from_stream
                (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_App,(istream *)&tstring);
      std::__cxx11::istringstream::~istringstream((istringstream *)&tstring);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  return;
}

Assistant:

void BrokerBase::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}